

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nhdp_3.c
# Opt level: O3

void write_packet(rfc5444_writer *w,rfc5444_writer_target *iface,void *buffer,size_t length)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  autobuf out;
  undefined1 local_50 [16];
  char *local_40;
  
  if (length != 0) {
    uVar4 = 0;
    do {
      printf("%04zx:",uVar4);
      uVar1 = uVar4 + 0x20;
      uVar2 = uVar1;
      if (length < uVar1) {
        uVar2 = length;
      }
      for (; uVar4 < uVar2; uVar4 = uVar4 + 1) {
        pcVar3 = "";
        if ((uVar4 & 3) == 0) {
          pcVar3 = " ";
        }
        printf("%s%02x",pcVar3,(ulong)*(byte *)((long)buffer + uVar4));
      }
      putchar(10);
      uVar4 = uVar1;
    } while (uVar1 < length);
  }
  putchar(10);
  abuf_init(local_50);
  rfc5444_print_raw(local_50,buffer,length);
  puts(local_40);
  abuf_free(local_50);
  return;
}

Assistant:

static void write_packet(struct rfc5444_writer *w __attribute__ ((unused)),
    struct rfc5444_writer_target *iface __attribute__((unused)),
    void *buffer, size_t length) {
  size_t i, j;
  uint8_t *buf = buffer;
  struct autobuf out;

  for (j=0; j<length; j+=32) {
    printf("%04zx:", j);

    for (i=j; i<length && i < j+32; i++) {
      printf("%s%02x", ((i&3) == 0) ? " " : "", (int)(buf[i]));
    }
    printf("\n");
  }
  printf("\n");

  abuf_init(&out);
  rfc5444_print_raw(&out, buf, length);
#if 0
  abuf_puts(&out, "\n\n\n");
  rfc5444_print_direct(&out, buf, length);
#endif

  printf("%s\n", abuf_getptr(&out));
  abuf_free(&out);
#if 0
  CHECK_TRUE(length == sizeof(result), "Result has wrong length: %zu != %zu", length, sizeof(result));
  if (length == sizeof(result)) {
    CHECK_TRUE(memcmp(result, buffer, sizeof(result)) == 0, "Result differs from pattern");
  }
#endif
}